

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationIterator::operator==(CollationIterator *this,CollationIterator *other)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  int local_24;
  int32_t i;
  CollationIterator *other_local;
  CollationIterator *this_local;
  
  if (this == (CollationIterator *)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                     (type_info *)(other->super_UObject)._vptr_UObject[-1]);
  if ((((bVar1) && ((this->ceBuffer).length == (other->ceBuffer).length)) &&
      (this->cesIndex == other->cesIndex)) &&
     ((this->numCpFwd == other->numCpFwd && (this->isNumeric == other->isNumeric)))) {
    for (local_24 = 0; local_24 < (this->ceBuffer).length; local_24 = local_24 + 1) {
      iVar2 = CEBuffer::get(&this->ceBuffer,local_24);
      iVar3 = CEBuffer::get(&other->ceBuffer,local_24);
      if (iVar2 != iVar3) {
        return '\0';
      }
    }
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationIterator::operator==(const CollationIterator &other) const {
    // Subclasses: Call this method and then add more specific checks.
    // Compare the iterator state but not the collation data (trie & data fields):
    // Assume that the caller compares the data.
    // Ignore skipped since that should be unused between calls to nextCE().
    // (It only stays around to avoid another memory allocation.)
    if(!(typeid(*this) == typeid(other) &&
            ceBuffer.length == other.ceBuffer.length &&
            cesIndex == other.cesIndex &&
            numCpFwd == other.numCpFwd &&
            isNumeric == other.isNumeric)) {
        return FALSE;
    }
    for(int32_t i = 0; i < ceBuffer.length; ++i) {
        if(ceBuffer.get(i) != other.ceBuffer.get(i)) { return FALSE; }
    }
    return TRUE;
}